

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O1

void nni_http_set_static_header(nng_http *conn,nni_http_header *h,char *key,char *val)

{
  nng_http_res *pnVar1;
  
  pnVar1 = &conn->res;
  if (conn->client != false) {
    pnVar1 = (nng_http_res *)&conn->req;
  }
  nni_http_del_header(conn,key);
  nni_list_node_remove(&h->node);
  h->field_0x20 = h->field_0x20 & 0xf8 | 3;
  h->name = key;
  h->value = val;
  nni_list_append(&(pnVar1->data).hdrs,h);
  return;
}

Assistant:

void
nni_http_set_static_header(
    nng_http *conn, nni_http_header *h, const char *key, const char *val)
{
	nni_list *headers;
	if (conn->client) {
		headers = &conn->req.data.hdrs;
	} else {
		headers = &conn->res.data.hdrs;
	}

	nni_http_del_header(conn, key);
	nni_list_node_remove(&h->node);
	h->alloc_header = false;
	h->static_name  = true;
	h->static_value = true;
	h->name         = (char *) key;
	h->value        = (char *) val;
	nni_list_append(headers, h);
}